

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# special_functions.hpp
# Opt level: O2

longdouble *
trng::math::detail::GammaQ_asympt<long_double>
          (longdouble *__return_storage_ptr__,longdouble a,longdouble x)

{
  longdouble *plVar1;
  longdouble in_ST0;
  longdouble eta;
  longdouble in_ST1;
  longdouble x_00;
  
  x_00 = (x - a) / a;
  mln1p<long_double>(__return_storage_ptr__,x_00);
  sqrtl();
  eta = ABS(in_ST1);
  if (((unkuint10)x_00 & 0x8000) != 0) {
    eta = -ABS(in_ST1);
  }
  sqrtl();
  erfcl();
  plVar1 = GammaPQ_asympt_R<long_double>(__return_storage_ptr__,a,eta,in_ST0);
  return plVar1;
}

Assistant:

TRNG_CUDA_ENABLE T GammaQ_asympt(T a, T x) {
        const T mu{(x - a) / a};
        const T eta_squared_half{mln1p(mu)};
        const T eta{copysign(sqrt(2 * eta_squared_half), mu)};
        const T leading{erfc(eta * sqrt(a / 2)) / 2};
        const T correction{GammaPQ_asympt_R(a, eta, eta_squared_half)};
        return leading + correction;
      }